

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSHelper.h
# Opt level: O0

void __thiscall Assimp::D3DS::Node::Node(Node *this,string *name)

{
  string *name_local;
  Node *this_local;
  
  this->mParent = (Node *)0x0;
  std::vector<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>::vector(&this->mChildren)
  ;
  std::__cxx11::string::string((string *)&this->mName,(string *)name);
  this->mInstanceNumber = 0;
  std::__cxx11::string::string((string *)&this->mDummyName);
  this->mHierarchyPos = 0;
  this->mHierarchyIndex = 0;
  std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::vector(&this->aRotationKeys);
  std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::vector(&this->aPositionKeys);
  std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::vector(&this->aScalingKeys);
  std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::vector(&this->aTargetPositionKeys);
  std::vector<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>::vector
            (&this->aCameraRollKeys);
  aiVector3t<float>::aiVector3t(&this->vPivot);
  this->mInstanceCount = 1;
  std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::reserve(&this->aRotationKeys,0x14);
  std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::reserve(&this->aPositionKeys,0x14);
  std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::reserve(&this->aScalingKeys,0x14);
  return;
}

Assistant:

explicit Node(const std::string &name)
    : mParent(NULL)
    , mName(name)
    , mInstanceNumber(0)
    , mHierarchyPos       (0)
    , mHierarchyIndex     (0)
    , mInstanceCount      (1)
    {
        aRotationKeys.reserve (20);
        aPositionKeys.reserve (20);
        aScalingKeys.reserve  (20);
    }